

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::register_control_dependent_expression(CompilerGLSL *this,uint32_t expr)

{
  SPIRBlock *pSVar1;
  bool bVar2;
  TypedID<(spirv_cross::Types)0> local_2c;
  _Node_iterator_base<unsigned_int,_false> local_28;
  _Node_iterator_base<unsigned_int,_false> local_20;
  uint32_t local_14;
  CompilerGLSL *pCStack_10;
  uint32_t expr_local;
  CompilerGLSL *this_local;
  
  local_14 = expr;
  pCStack_10 = this;
  local_20._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(&(this->super_Compiler).forwarded_temporaries,&local_14);
  local_28._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                 (&(this->super_Compiler).forwarded_temporaries);
  bVar2 = ::std::__detail::operator==(&local_20,&local_28);
  if (!bVar2) {
    if (this->current_emitting_block == (SPIRBlock *)0x0) {
      __assert_fail("current_emitting_block",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x2429,
                    "void spirv_cross::CompilerGLSL::register_control_dependent_expression(uint32_t)"
                   );
    }
    pSVar1 = this->current_emitting_block;
    TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,local_14);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
              (&pSVar1->invalidate_expressions,&local_2c);
  }
  return;
}

Assistant:

void CompilerGLSL::register_control_dependent_expression(uint32_t expr)
{
	if (forwarded_temporaries.find(expr) == end(forwarded_temporaries))
		return;

	assert(current_emitting_block);
	current_emitting_block->invalidate_expressions.push_back(expr);
}